

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_pkits_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_17::CrlCheckingPathBuilderDelegate::CheckPathAfterVerification
          (CrlCheckingPathBuilderDelegate *this,CertPathBuilder *path_builder,
          CertPathBuilderResultPath *path)

{
  pointer pbVar1;
  optional<long> max_age_seconds;
  bool bVar2;
  CRLRevocationStatus CVar3;
  pointer pPVar4;
  ParsedDistributionPoint *pPVar5;
  CertErrors *pCVar6;
  ParsedExtension *parsed_extension;
  ParsedDistributionPoint *cert_dp;
  ulong uVar7;
  size_t cert_index;
  char *in_R9;
  ulong uVar8;
  pointer pbVar9;
  Input extension_oid;
  Input extension_value;
  string_view raw_crl;
  AssertHelper local_130;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_128;
  CertPathErrors *local_120;
  AssertionResult gtest_ar_;
  vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
  distribution_points;
  undefined7 uStack_cf;
  ParsedExtension crl_dp_extension;
  string local_a0;
  ParsedDistributionPoint fake_cert_dp;
  
  SimplePathBuilderDelegate::CheckPathAfterVerification
            (&this->super_SimplePathBuilderDelegate,path_builder,path);
  bVar2 = CertPathBuilderResultPath::IsValid(path);
  if (bVar2) {
    local_120 = &path->errors;
    uVar8 = 0;
    while( true ) {
      uVar7 = (long)(path->certs).
                    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(path->certs).
                    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (uVar7 <= uVar8) break;
      if ((uVar8 != 0) || (bVar2 = CertificateTrust::IsTrustAnchor(&path->last_cert_trust), !bVar2))
      {
        cert_index = uVar7 + ~uVar8;
        ParsedDistributionPoint::ParsedDistributionPoint(&fake_cert_dp);
        distribution_points.
        super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        distribution_points.
        super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        distribution_points.
        super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        crl_dp_extension.value.data_.data_ = (uchar *)0x0;
        crl_dp_extension.value.data_.size_ = 0;
        crl_dp_extension.oid.data_.data_ = (uchar *)0x0;
        crl_dp_extension.oid.data_.size_ = 0;
        crl_dp_extension.critical = false;
        parsed_extension = &crl_dp_extension;
        extension_oid.data_.size_ = 3;
        extension_oid.data_.data_ = "U\x1d\x1fEncodeValuesTest";
        bVar2 = ParsedCertificate::GetExtension
                          ((path->certs).
                           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[cert_index].
                           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,extension_oid,parsed_extension);
        cert_dp = &fake_cert_dp;
        if (bVar2) {
          extension_value.data_.size_ = (size_t)&distribution_points;
          extension_value.data_.data_ = (uchar *)crl_dp_extension.value.data_.size_;
          gtest_ar_.success_ =
               ParseCrlDistributionPoints
                         ((bssl *)crl_dp_extension.value.data_.data_,extension_value,
                          (vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                           *)parsed_extension);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_128);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a0,(internal *)&gtest_ar_,
                       (AssertionResult *)
                       "ParseCrlDistributionPoints(crl_dp_extension.value, &distribution_points)",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_130,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                       ,0x58,local_a0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_130);
            ::std::__cxx11::string::~string((string *)&local_a0);
            if (local_128._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_128._M_head_impl + 8))();
            }
            ::std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
LAB_00260bf7:
            ::std::
            vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>::
            ~vector(&distribution_points);
            ParsedDistributionPoint::~ParsedDistributionPoint(&fake_cert_dp);
            return;
          }
          ::std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          pPVar4 = distribution_points.
                   super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          while ((pPVar5 = &fake_cert_dp,
                 pPVar4 != distribution_points.
                           super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                           ._M_impl.super__Vector_impl_data._M_finish &&
                 (pPVar5 = pPVar4,
                 (pPVar4->reasons).super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                 super__Optional_payload_base<bssl::der::Input>._M_engaged == true))) {
            pPVar4 = pPVar4 + 1;
          }
          cert_dp = distribution_points.
                    super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (distribution_points.
              super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              distribution_points.
              super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            cert_dp = pPVar5;
          }
          if (pPVar5 != &fake_cert_dp) {
            cert_dp = pPVar5;
          }
        }
        pbVar1 = (this->der_crls_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar9 = (this->der_crls_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar1;
            pbVar9 = pbVar9 + 1) {
          in_R9 = (char *)this->verify_time_;
          max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._9_7_ = uStack_cf;
          max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged = true;
          max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload =
               (_Storage<long,_true>)(_Storage<long,_true>)this->max_age_;
          raw_crl._M_str = (pbVar9->_M_dataplus)._M_p;
          raw_crl._M_len = pbVar9->_M_string_length;
          CVar3 = CheckCRL(raw_crl,&path->certs,cert_index,cert_dp,(int64_t)in_R9,max_age_seconds);
          if (CVar3 == GOOD) goto LAB_00260bb1;
          if (CVar3 == REVOKED) {
            pCVar6 = CertPathErrors::GetErrorsForCert(local_120,cert_index);
            CertErrors::AddError(pCVar6,"Certificate is revoked");
            goto LAB_00260bf7;
          }
        }
        pCVar6 = CertPathErrors::GetErrorsForCert(local_120,cert_index);
        CertErrors::AddError(pCVar6,"Unable to check revocation");
LAB_00260bb1:
        ::std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ::~vector(&distribution_points);
        ParsedDistributionPoint::~ParsedDistributionPoint(&fake_cert_dp);
      }
      uVar8 = uVar8 + 1;
    }
  }
  return;
}

Assistant:

void CheckPathAfterVerification(const CertPathBuilder &path_builder,
                                  CertPathBuilderResultPath *path) override {
    SimplePathBuilderDelegate::CheckPathAfterVerification(path_builder, path);

    if (!path->IsValid()) {
      return;
    }

    // It would be preferable if this test could use
    // CheckValidatedChainRevocation somehow, but that only supports getting
    // CRLs by http distributionPoints. So this just settles for writing a
    // little bit of wrapper code to test CheckCRL directly.
    const ParsedCertificateList &certs = path->certs;
    for (size_t reverse_i = 0; reverse_i < certs.size(); ++reverse_i) {
      size_t i = certs.size() - reverse_i - 1;

      // Trust anchors bypass OCSP/CRL revocation checks. (The only way to
      // revoke trust anchors is via CRLSet or the built-in SPKI block list).
      if (reverse_i == 0 && path->last_cert_trust.IsTrustAnchor()) {
        continue;
      }

      // RFC 5280 6.3.3.  [If the CRL was not specified in a distribution
      //                  point], assume a DP with both the reasons and the
      //                  cRLIssuer fields omitted and a distribution point
      //                  name of the certificate issuer.
      // Since this implementation only supports URI names in distribution
      // points, this means a default-initialized ParsedDistributionPoint is
      // sufficient.
      ParsedDistributionPoint fake_cert_dp;
      const ParsedDistributionPoint *cert_dp = &fake_cert_dp;

      // If the target cert does have a distribution point, use it.
      std::vector<ParsedDistributionPoint> distribution_points;
      ParsedExtension crl_dp_extension;
      if (certs[i]->GetExtension(der::Input(kCrlDistributionPointsOid),
                                 &crl_dp_extension)) {
        ASSERT_TRUE(ParseCrlDistributionPoints(crl_dp_extension.value,
                                               &distribution_points));
        // TODO(mattm): some test cases (some of the 4.14.* onlySomeReasons
        // tests)) have two CRLs and two distribution points, one point
        // corresponding to each CRL.  Should select the matching point for
        // each CRL.  (Doesn't matter currently since we don't support
        // reasons.)

        // Look for a DistributionPoint without reasons.
        for (const auto &dp : distribution_points) {
          if (!dp.reasons) {
            cert_dp = &dp;
            break;
          }
        }
        // If there were only DistributionPoints with reasons, just use the
        // first one.
        if (cert_dp == &fake_cert_dp && !distribution_points.empty()) {
          cert_dp = &distribution_points[0];
        }
      }

      bool cert_good = false;

      for (const auto &der_crl : der_crls_) {
        CRLRevocationStatus crl_status =
            CheckCRL(der_crl, certs, i, *cert_dp, verify_time_, max_age_);
        if (crl_status == CRLRevocationStatus::REVOKED) {
          path->errors.GetErrorsForCert(i)->AddError(
              cert_errors::kCertificateRevoked);
          return;
        }
        if (crl_status == CRLRevocationStatus::GOOD) {
          cert_good = true;
          break;
        }
      }
      if (!cert_good) {
        // PKITS tests assume hard-fail revocation checking.
        // From PKITS 4.4: "When running the tests in this section, the
        // application should be configured in such a way that the
        // certification path is not accepted unless valid, up-to-date
        // revocation data is available for every certificate in the path."
        path->errors.GetErrorsForCert(i)->AddError(
            cert_errors::kUnableToCheckRevocation);
      }
    }
  }